

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

ProgramSources * __thiscall
deqp::gles3::Functional::anon_unknown_0::ScaleProgram::getSources
          (ProgramSources *__return_storage_ptr__,ScaleProgram *this)

{
  ProgramSources *pPVar1;
  allocator<char> local_111;
  string local_110;
  TransformFeedbackVarying local_f0;
  TransformFeedbackMode local_d0;
  allocator<char> local_c9;
  string local_c8;
  ShaderSource local_a8;
  allocator<char> local_69;
  string local_68;
  ShaderSource local_48;
  undefined1 local_19;
  ScaleProgram *local_18;
  ScaleProgram *this_local;
  ProgramSources *sources;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ScaleProgram *)__return_storage_ptr__;
  glu::ProgramSources::ProgramSources(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "#version 100\nattribute vec4 pos; uniform float scale; void main () { gl_Position = vec4(scale * pos.xy, pos.zw); }\n"
             ,&local_69);
  glu::VertexSource::VertexSource((VertexSource *)&local_48,&local_68);
  pPVar1 = glu::ProgramSources::operator<<(__return_storage_ptr__,&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "#version 100\nvoid main () { gl_FragColor = vec4(1.0, 0.0, 1.0, 1.0); }\n",&local_c9);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_a8,&local_c8);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_a8);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_d0,0x8c8c);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"gl_Position",&local_111);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_f0,&local_110);
  glu::ProgramSources::operator<<(pPVar1,&local_f0);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::VertexSource::~VertexSource((VertexSource *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

ProgramSources ScaleProgram::getSources (void)
{
	using namespace glu;
	ProgramSources sources;
	sources << VertexSource(s_vertexShaderSrc)
			<< FragmentSource(s_fragmentShaderSrc)
			<< TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
			<< TransformFeedbackVarying("gl_Position");
	return sources;
}